

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegion.cpp
# Opt level: O0

void __thiscall ThreadRegion::ThreadRegion(ThreadRegion *this,Node *node)

{
  int iVar1;
  undefined8 in_RSI;
  int *in_RDI;
  
  iVar1 = lastId + 1;
  *in_RDI = lastId;
  lastId = iVar1;
  *(undefined8 *)(in_RDI + 2) = in_RSI;
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::set
            ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)0x1b3ee2);
  std::set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>::set
            ((set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_> *)
             0x1b3eef);
  std::set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>::set
            ((set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_> *)
             0x1b3efc);
  return;
}

Assistant:

ThreadRegion::ThreadRegion(Node *node) : id_(lastId++), foundingNode_(node) {}